

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helpers.cc
# Opt level: O0

int google::protobuf::compiler::cpp::EstimateAlignmentSize(FieldDescriptor *field)

{
  bool bVar1;
  CppType CVar2;
  LogMessage *pLVar3;
  LogMessage local_30;
  Voidify local_19;
  FieldDescriptor *local_18;
  FieldDescriptor *field_local;
  
  if (field == (FieldDescriptor *)0x0) {
    return 0;
  }
  local_18 = field;
  bVar1 = FieldDescriptor::is_repeated(field);
  if (bVar1) {
    return 8;
  }
  CVar2 = FieldDescriptor::cpp_type(local_18);
  if (CVar2 != CPPTYPE_INT32) {
    if (CVar2 == CPPTYPE_INT64) {
      return 8;
    }
    if (CVar2 != CPPTYPE_UINT32) {
      if (CVar2 - CPPTYPE_UINT64 < 2) {
        return 8;
      }
      if (CVar2 != CPPTYPE_FLOAT) {
        if (CVar2 == CPPTYPE_BOOL) {
          return 1;
        }
        if (CVar2 != CPPTYPE_ENUM) {
          if (CVar2 - CPPTYPE_STRING < 2) {
            return 8;
          }
          absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                    ((LogMessageFatal *)&local_30,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/helpers.cc"
                     ,0x2c1);
          pLVar3 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
          pLVar3 = absl::lts_20250127::log_internal::LogMessage::operator<<
                             (pLVar3,(char (*) [16])"Can\'t get here.");
          absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar3);
          absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                    ((LogMessageFatal *)&local_30);
        }
      }
    }
  }
  return 4;
}

Assistant:

int EstimateAlignmentSize(const FieldDescriptor* field) {
  if (field == nullptr) return 0;
  if (field->is_repeated()) return 8;
  switch (field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_BOOL:
      return 1;

    case FieldDescriptor::CPPTYPE_INT32:
    case FieldDescriptor::CPPTYPE_UINT32:
    case FieldDescriptor::CPPTYPE_ENUM:
    case FieldDescriptor::CPPTYPE_FLOAT:
      return 4;

    case FieldDescriptor::CPPTYPE_INT64:
    case FieldDescriptor::CPPTYPE_UINT64:
    case FieldDescriptor::CPPTYPE_DOUBLE:
    case FieldDescriptor::CPPTYPE_STRING:
    case FieldDescriptor::CPPTYPE_MESSAGE:
      return 8;
  }
  ABSL_LOG(FATAL) << "Can't get here.";
  return -1;  // Make compiler happy.
}